

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall djb::merl::merl(merl *this,char *path_to_file)

{
  char cVar1;
  exc *this_00;
  int32_t dims [3];
  fstream f;
  int local_234;
  int local_230;
  int local_22c;
  long local_228 [4];
  byte abStack_208 [496];
  
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_00202eb0;
  (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::fstream(local_228,path_to_file,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    this_00 = (exc *)__cxa_allocate_exception(0x28);
    exc::exc(this_00,"djb_error: Failed to open %s\n",path_to_file);
  }
  else {
    std::istream::read((char *)local_228,(long)&local_234);
    local_22c = local_230 * local_234 * local_22c;
    if (local_22c < 1) {
      this_00 = (exc *)__cxa_allocate_exception(0x28);
      exc::exc(this_00,"djb_error: Failed to read MERL header\n");
    }
    else {
      std::vector<double,_std::allocator<double>_>::resize
                (&this->m_samples,(ulong)(uint)(local_22c * 3));
      std::istream::read((char *)local_228,
                         (long)(this->m_samples).super__Vector_base<double,_std::allocator<double>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
        std::fstream::~fstream(local_228);
        return;
      }
      this_00 = (exc *)__cxa_allocate_exception(0x28);
      exc::exc(this_00,"djb_error: Reading %s failed\n",path_to_file);
    }
  }
  __cxa_throw(this_00,&exc::typeinfo,exc::~exc);
}

Assistant:

merl::merl(const char *path_to_file)
{
	std::fstream f(path_to_file, std::fstream::in | std::fstream::binary);
	int32_t n, dims[3];

	// check file
	if (!f.is_open())
		throw exc("djb_error: Failed to open %s\n", path_to_file);

	// read header
	f.read((char *)dims, /*bytes*/4 * 3);
	n = dims[0] * dims[1] * dims[2];
	if (n <= 0)
		throw exc("djb_error: Failed to read MERL header\n");

	// allocate brdf and read data
	m_samples.resize(3 * n);
	f.read((char *)&m_samples[0], sizeof(double) * 3 * n);
	if (f.fail())
		throw exc("djb_error: Reading %s failed\n", path_to_file);
}